

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,int *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  Printer *in_RSI;
  string *this_00;
  char *in_R8;
  string *in_stack_fffffffffffffed8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef0;
  allocator_type *in_stack_ffffffffffffff08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  string *psVar1;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined1 *puVar2;
  undefined1 local_c5 [13];
  string *local_b8;
  string local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string *local_50;
  undefined8 local_48;
  
  local_b8 = local_b0;
  ToString<int,void>(in_stack_ffffffffffffff1c);
  local_b8 = (string *)local_90;
  ToString<int,void>(in_stack_ffffffffffffff1c);
  local_b8 = (string *)local_70;
  ToString(in_stack_fffffffffffffed8);
  local_50 = local_b0;
  local_48 = 3;
  puVar2 = local_c5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x562551);
  __l._M_array._4_4_ = in_stack_ffffffffffffff1c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff18;
  __l._M_len = (size_type)puVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff10,__l,in_stack_ffffffffffffff08);
  io::Printer::FormatInternal(in_RSI,in_RDX,in_RCX,in_R8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffef0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x5625b1);
  psVar1 = local_b0;
  this_00 = (string *)&local_50;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar1);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }